

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_suite.cpp
# Opt level: O0

void test_array_u32string(void)

{
  size_type in_RCX;
  basic_variable<std::allocator<char>_> *pbVar1;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  basic_variable<std::allocator<char>_> *local_298;
  basic_variable<std::allocator<char>_> *local_280;
  iterator local_270;
  iterator local_258;
  iterator local_240;
  iterator local_228;
  basic_variable<std::allocator<char>_> *local_210;
  basic_variable<std::allocator<char>_> local_208;
  basic_variable<std::allocator<char>_> local_1d8;
  undefined1 local_1a8 [24];
  variable expect;
  iterator local_150;
  undefined1 local_138 [8];
  iterator end;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_108,L"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_d8,L"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_a8,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_78,L"bravo");
  local_48._0_8_ = &local_108;
  local_48._8_8_ = 4;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x4;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  pbVar1 = &local_108;
  local_280 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_280 = local_280 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_280);
  } while (local_280 != pbVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_150,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)&expect.storage.field_0x28,
             (basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::unique<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_138,&local_150,(iterator *)&expect.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)&expect.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_150);
  local_210 = &local_208;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_210,L"alpha");
  local_210 = &local_1d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_210,L"bravo");
  local_1a8._0_8_ = &local_208;
  local_1a8._8_8_ = 2;
  init_00._M_len = (size_type)pbVar1;
  init_00._M_array = (iterator)0x2;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_1a8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_1a8._0_8_,init_00);
  local_298 = (basic_variable<std::allocator<char>_> *)local_1a8;
  do {
    local_298 = local_298 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_298);
  } while (local_298 != &local_208);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_228,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_240,(iterator *)local_138);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_258,(basic_variable<std::allocator<char>_> *)(local_1a8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_270,(basic_variable<std::allocator<char>_> *)(local_1a8 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/unique_suite.cpp"
             ,0xa4,"void test_array_u32string()",&local_228,&local_240,&local_258,&local_270);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_270);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_258);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_240);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_228);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_1a8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_138);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void test_array_u32string()
{
    variable data = array::make({ U"alpha", U"alpha", U"bravo", U"bravo" });
    auto end = std::unique(data.begin(), data.end());
    variable expect = array::make({ U"alpha", U"bravo" });
    TRIAL_PROTOCOL_TEST_ALL_WITH(data.begin(), end,
                                 expect.begin(), expect.end(),
                                 std::equal_to<variable>());
}